

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::FatalConditionHandler::reset(void)

{
  undefined1 *__act;
  long lVar1;
  
  if (isSet == '\x01') {
    __act = oldSigActions;
    lVar1 = 0;
    do {
      sigaction(*(int *)((long)&signalDefs + lVar1),(sigaction *)__act,(sigaction *)0x0);
      lVar1 = lVar1 + 0x10;
      __act = (undefined1 *)((long)__act + 0x98);
    } while (lVar1 != 0x60);
    sigaltstack((sigaltstack *)oldSigStack,(sigaltstack *)0x0);
    isSet = '\0';
  }
  return;
}

Assistant:

static void reset() {
            if( isSet ) {
                // Set signals back to previous values -- hopefully nobody overwrote them in the meantime
                for( std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i ) {
                    sigaction(signalDefs[i].id, &oldSigActions[i], CATCH_NULL);
                }
                // Return the old stack
                sigaltstack(&oldSigStack, CATCH_NULL);
                isSet = false;
            }
        }